

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlExpression.cpp
# Opt level: O1

GdlExpression * __thiscall
GdlNumericExpression::ConvertFeatureSettingValue
          (GdlNumericExpression *this,GdlFeatureDefn *pfeat,bool *fErr)

{
  string local_38;
  
  if (pfeat->m_fStdLang == true) {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,"Numeric value where language ID string expected","");
    GrcErrorList::AddWarning(&g_errorList,0x9d6,(GdlObject *)&this->field_0x8,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  return (GdlExpression *)this;
}

Assistant:

GdlExpression * GdlNumericExpression::ConvertFeatureSettingValue(GdlFeatureDefn * pfeat, bool & fErr)
{
	if (pfeat->IsLanguageFeature())
		g_errorList.AddWarning(2518, this,
			"Numeric value where language ID string expected");

	return this;
}